

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O1

int ffikym(fitsfile *fptr,char *keyname,double *value,int decim,char *comm,int *status)

{
  size_t sVar1;
  size_t sVar2;
  char valstring [71];
  char tmpstring [71];
  char card [81];
  char local_128 [80];
  char local_d8 [80];
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  local_128[0] = '(';
  local_128[1] = '\0';
  ffd2e(*value,decim,local_d8,status);
  sVar1 = strlen(local_d8);
  if (0xffffffffffffffb8 < sVar1 - 0x44) {
    strcat(local_128,local_d8);
    sVar1 = strlen(local_128);
    (local_128 + sVar1)[0] = ',';
    (local_128 + sVar1)[1] = ' ';
    local_128[sVar1 + 2] = '\0';
    ffd2e(value[1],decim,local_d8,status);
    sVar1 = strlen(local_128);
    sVar2 = strlen(local_d8);
    if (0xffffffffffffffb8 < (sVar2 + sVar1) - 0x46) {
      strcat(local_128,local_d8);
      sVar1 = strlen(local_128);
      (local_128 + sVar1)[0] = ')';
      (local_128 + sVar1)[1] = '\0';
      ffmkky(keyname,local_128,comm,local_88,status);
      ffikey(fptr,local_88,status);
      return *status;
    }
  }
  ffpmsg("complex key value too long (ffikym)");
  *status = 0x192;
  return 0x192;
}

Assistant:

int ffikym(fitsfile *fptr,          /* I - FITS file pointer  */
           const char *keyname,     /* I - keyword name       */
           double *value,           /* I - keyword value      */
           int decim,               /* I - no of decimals     */
           const char *comm,        /* I - keyword comment    */ 
           int *status)             /* IO - error status      */
{
    char valstring[FLEN_VALUE], tmpstring[FLEN_VALUE];
    char card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    strcpy(valstring, "(" );
    ffd2e(value[0], decim, tmpstring, status); /* convert to string */
    if (strlen(tmpstring)+3 > FLEN_VALUE-1)
    {
       ffpmsg("complex key value too long (ffikym)");
       return(*status=BAD_F2C);
    }
    strcat(valstring, tmpstring);
    strcat(valstring, ", ");
    ffd2e(value[1], decim, tmpstring, status); /* convert to string */
    if (strlen(valstring) + strlen(tmpstring)+1 > FLEN_VALUE-1)
    {
       ffpmsg("complex key value too long (ffikym)");
       return(*status=BAD_F2C);
    }
    strcat(valstring, tmpstring);
    strcat(valstring, ")");

    ffmkky(keyname, valstring, comm, card, status);  /* construct the keyword*/
    ffikey(fptr, card, status);  /* write the keyword*/

    return(*status);
}